

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.hpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
* __thiscall
trial::dynamic::convert::
into<std::map<std::__cxx11::string,std::__cxx11::wstring,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::wstring>>>,trial::dynamic::basic_variable<std::allocator<char>>>
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
           *__return_storage_ptr__,convert *this,basic_variable<std::allocator<char>_> *u)

{
  system_error *this_00;
  error_code __ec;
  error_code error;
  error_code local_28;
  
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  overloader<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
  ::into(__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)this,&local_28);
  if (local_28._M_value == 0) {
    return __return_storage_ptr__;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  __ec._4_4_ = 0;
  __ec._M_value = local_28._M_value;
  __ec._M_cat = local_28._M_cat;
  std::system_error::system_error(this_00,__ec);
  *(undefined ***)this_00 = &PTR__system_error_00131900;
  __cxa_throw(this_00,&dynamic::error::typeinfo,std::system_error::~system_error);
}

Assistant:

T into(const U& u)
{
    std::error_code error;
    auto result = into<T>(u, error);
    if (error)
        throw dynamic::error(error);
    return result;
}